

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptProxy::SetPropertyTrap
          (JavascriptProxy *this,Var receiver,SetPropertyTrapKind setPropertyTrapKind,
          PropertyId propertyId,Var newValue,ScriptContext *requestContext,
          PropertyOperationFlags propertyOperationFlags,BOOL skipPrototypeCheck)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  code *pcVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  Attributes attributes;
  BOOL BVar6;
  Var pvVar7;
  RecyclableObject *object;
  JavascriptFunction *pJVar8;
  undefined4 *puVar9;
  Var pvVar10;
  JavascriptMethod p_Var11;
  RecyclableObject *ptr;
  PropertyRecord *pPVar12;
  undefined1 local_a8 [8];
  PropertyDescriptor targetDescriptor;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_00 = requestContext->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  BVar6 = 0;
  pvVar7 = CrossSite::MarshalVar(requestContext,(this->handler).ptr,false);
  if (pvVar7 == (Var)0x0) {
    bVar4 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar4) {
      return 0;
    }
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"set");
  }
  object = (RecyclableObject *)CrossSite::MarshalVar(requestContext,(this->target).ptr,false);
  pJVar8 = GetMethodHelper(this,0x19b,requestContext);
  bVar4 = Memory::Recycler::IsHeapEnumInProgress
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     recycler);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x73d,"(!GetScriptContext()->IsHeapEnumInProgress())",
                                "!GetScriptContext()->IsHeapEnumInProgress()");
    if (!bVar4) goto LAB_00d0d6a7;
    *puVar9 = 0;
  }
  if (pJVar8 != (JavascriptFunction *)0x0) goto LAB_00d0d35c;
  switch(setPropertyTrapKind) {
  case SetItemOnTaggedNumberKind:
    BVar6 = ScriptContext::IsNumericPropertyId(requestContext,propertyId,(uint32 *)local_a8);
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x747,"(isNumericPropertyId)","isNumericPropertyId");
      if (!bVar4) goto LAB_00d0d6a7;
      *puVar9 = 0;
    }
    BVar6 = JavascriptOperators::SetItemOnTaggedNumber
                      (receiver,object,local_a8._0_4_,newValue,requestContext,propertyOperationFlags
                      );
    break;
  case SetPropertyOnTaggedNumberKind:
    BVar6 = JavascriptOperators::SetPropertyOnTaggedNumber
                      (receiver,object,propertyId,newValue,requestContext,propertyOperationFlags);
    break;
  case SetPropertyKind:
    BVar6 = JavascriptOperators::SetProperty
                      (receiver,object,propertyId,newValue,requestContext,propertyOperationFlags);
    break;
  case SetItemKind:
    BVar6 = ScriptContext::IsNumericPropertyId(requestContext,propertyId,(uint32 *)local_a8);
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                  ,0x752,"(isNumericPropertyId)","isNumericPropertyId");
      if (!bVar4) goto LAB_00d0d6a7;
      *puVar9 = 0;
    }
    BVar6 = JavascriptOperators::SetItem
                      (receiver,object,local_a8._0_4_,newValue,requestContext,propertyOperationFlags
                       ,skipPrototypeCheck);
    break;
  case SetPropertyWPCacheKind:
    bVar4 = false;
    local_a8 = (undefined1  [8])0x0;
    targetDescriptor.Value.ptr = (void *)0x50000ffff;
    targetDescriptor.Getter.ptr = (void *)0x0;
    targetDescriptor.Setter.ptr = (void *)0x0;
    targetDescriptor.originalVar.ptr = (void *)0x0;
    targetDescriptor.writableSpecified = false;
    targetDescriptor.enumerableSpecified = false;
    targetDescriptor.configurableSpecified = false;
    targetDescriptor.valueSpecified = false;
    targetDescriptor.getterSpecified = false;
    targetDescriptor.setterSpecified = false;
    targetDescriptor.Writable = false;
    targetDescriptor.Enumerable = false;
    targetDescriptor.Configurable = false;
    targetDescriptor.fromProxy = false;
    targetDescriptor._42_6_ = 0;
    BVar6 = JavascriptOperators::SetPropertyWPCache<int>
                      (receiver,object,propertyId,newValue,requestContext,propertyOperationFlags,
                       (PropertyValueInfo *)local_a8);
    goto LAB_00d0d353;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x75b,"(0)","0");
    if (!bVar4) {
LAB_00d0d6a7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
    bVar4 = true;
    goto LAB_00d0d353;
  }
  bVar4 = false;
LAB_00d0d353:
  if (!bVar4) {
    return BVar6;
  }
LAB_00d0d35c:
  pvVar10 = GetName(requestContext,propertyId);
  bVar4 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)pJVar8);
  bVar5 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)pJVar8,attributes);
  if (bVar5) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar8);
    CheckIsExecutable((RecyclableObject *)pJVar8,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar8);
    ptr = (RecyclableObject *)
          (*p_Var11)((RecyclableObject *)pJVar8,(CallInfo)pJVar8,0x2000005,0,0,0,0,0x2000005,pvVar7,
                     object,pvVar10,newValue,receiver);
    bVar5 = ThreadContext::IsOnStack(ptr);
LAB_00d0d40e:
    if (bVar5 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar8);
      CheckIsExecutable((RecyclableObject *)pJVar8,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar8);
      ptr = (RecyclableObject *)
            (*p_Var11)((RecyclableObject *)pJVar8,(CallInfo)pJVar8,0x2000005,0,0,0,0,0x2000005,
                       pvVar7,object,pvVar10,newValue,receiver);
      bVar5 = ThreadContext::IsOnStack(ptr);
      goto LAB_00d0d40e;
    }
    IVar1 = this_00->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar8);
    CheckIsExecutable((RecyclableObject *)pJVar8,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)pJVar8);
    ptr = (RecyclableObject *)
          (*p_Var11)((RecyclableObject *)pJVar8,(CallInfo)pJVar8,0x2000005,0,0,0,0,0x2000005,pvVar7,
                     object,pvVar10,newValue,receiver);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((pJVar8->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary)
               .ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
           javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  this_00->reentrancySafeOrHandled = bVar4;
  BVar6 = JavascriptConversion::ToBoolean(ptr,requestContext);
  if (BVar6 == 0) {
    BVar6 = 0;
    if ((propertyOperationFlags & PropertyOperation_StrictMode) != PropertyOperation_None) {
      pPVar12 = ScriptContext::GetPropertyName(requestContext,propertyId);
      JavascriptError::ThrowTypeErrorVar(requestContext,-0x7ff5e9d4,L"set",pPVar12 + 1);
    }
  }
  else {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_a8);
    BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                      (object,propertyId,requestContext,(PropertyDescriptor *)local_a8);
    if (BVar6 != 0) {
      cVar3 = targetDescriptor.originalVar.ptr._3_1_;
      bVar4 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_a8);
      if (cVar3 == '\x01') {
        if ((!bVar4) &&
           ((bVar4 = PropertyDescriptor::IsWritable((PropertyDescriptor *)local_a8), !bVar4 &&
            (bVar4 = JavascriptConversion::SameValueCommon<false>(newValue,(Var)local_a8), !bVar4)))
           ) {
LAB_00d0d6b8:
          JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"set");
        }
      }
      else if ((!bVar4) &&
              (pJVar8 = (JavascriptFunction *)
                        PropertyDescriptor::GetSetter((PropertyDescriptor *)local_a8),
              pJVar8 == (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                        super_JavascriptLibraryBase).defaultAccessorFunction.ptr))
      goto LAB_00d0d6b8;
    }
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    BVar6 = 1;
  }
  return BVar6;
}

Assistant:

BOOL JavascriptProxy::SetPropertyTrap(Var receiver, SetPropertyTrapKind setPropertyTrapKind, PropertyId propertyId, Var newValue, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags, BOOL skipPrototypeCheck)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        //1. Assert: IsPropertyKey(P) is true.
        //2. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("set"));
        }

        //4. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        //5. Let trap be the result of GetMethod(handler, "set").
        //6. ReturnIfAbrupt(trap).
        //7. If trap is undefined, then
        //a.Return the result of calling the[[Set]] internal method of target with arguments P, V, and Receiver.
        JavascriptFunction* setMethod = GetMethodHelper(PropertyIds::set, requestContext);

        Assert(!GetScriptContext()->IsHeapEnumInProgress());
        if (nullptr == setMethod)
        {
            PropertyValueInfo info;
            switch (setPropertyTrapKind)
            {
            case SetPropertyTrapKind::SetItemOnTaggedNumberKind:
            {
                uint32 indexVal;
                BOOL isNumericPropertyId = requestContext->IsNumericPropertyId(propertyId, &indexVal);
                Assert(isNumericPropertyId);
                return JavascriptOperators::SetItemOnTaggedNumber(receiver, targetObj, indexVal, newValue, requestContext, propertyOperationFlags);
            }
            case SetPropertyTrapKind::SetPropertyOnTaggedNumberKind:
                return JavascriptOperators::SetPropertyOnTaggedNumber(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags);
            case SetPropertyTrapKind::SetPropertyKind:
                return JavascriptOperators::SetProperty(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags);
            case SetPropertyTrapKind::SetItemKind:
            {
                uint32 indexVal;
                BOOL isNumericPropertyId = requestContext->IsNumericPropertyId(propertyId, &indexVal);
                Assert(isNumericPropertyId);
                return  JavascriptOperators::SetItem(receiver, targetObj, indexVal, newValue, requestContext, propertyOperationFlags, skipPrototypeCheck);
            }
            case SetPropertyTrapKind::SetPropertyWPCacheKind:
            {
                PropertyValueInfo propertyValueInfo;
                return JavascriptOperators::SetPropertyWPCache(receiver, targetObj, propertyId, newValue, requestContext, propertyOperationFlags, &propertyValueInfo);
            }
            default:
                AnalysisAssert(FALSE);
            }
        }
        //8. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target, P, V, and Receiver.
        //9. Let booleanTrapResult be ToBoolean(trapResult).
        //10. ReturnIfAbrupt(booleanTrapResult).
        //11. If booleanTrapResult is false, then return false.

        Var propertyName = GetName(requestContext, propertyId);

        Var setPropertyResult = threadContext->ExecuteImplicitCall(setMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, setMethod, CallInfo(CallFlags_Value, 5), handlerObj, targetObj, propertyName, newValue, receiver);
        });

        BOOL setResult = JavascriptConversion::ToBoolean(setPropertyResult, requestContext);
        if (!setResult)
        {
            if (propertyOperationFlags & PropertyOperation_StrictMode)
            {
                JavascriptError::ThrowTypeErrorVar(
                    requestContext,
                    JSERR_ProxyHandlerReturnedFalse,
                    _u("set"),
                    requestContext->GetPropertyName(propertyId)->GetBuffer()
                );
            }
            return setResult;
        }

        //12. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //13. ReturnIfAbrupt(targetDesc).
        //14. If targetDesc is not undefined, then
        //a.If IsDataDescriptor(targetDesc) and targetDesc.[[Configurable]] is false and targetDesc.[[Writable]] is false, then
        //i.If SameValue(V, targetDesc.[[Value]]) is false, then throw a TypeError exception.
        //b.If IsAccessorDescriptor(targetDesc) and targetDesc.[[Configurable]] is false, then
        //i.If targetDesc.[[Set]] is undefined, then throw a TypeError exception.
        //15. Return true
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty;

        hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetDescriptor);
        if (hasProperty)
        {
            if (targetDescriptor.ValueSpecified())
            {
                if (!targetDescriptor.IsConfigurable() && !targetDescriptor.IsWritable() &&
                    !JavascriptConversion::SameValue(newValue, targetDescriptor.GetValue()))
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("set"));
                }
            }
            else
            {
                if (!targetDescriptor.IsConfigurable() && targetDescriptor.GetSetter() == requestContext->GetLibrary()->GetDefaultAccessorFunction())
                {
                    JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("set"));
                }
            }
        }

        threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);

        return TRUE;

    }